

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O2

void test_readers_writers_with_handle_pool
               (int nhandles,int nfiles,int writers,int readers,bool useSnapHandlePool,int time)

{
  SnapHandlePool *this;
  pthread_t *ppVar1;
  int j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  pthread_t *ppVar8;
  bool bVar9;
  string test_title;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ops_args oa;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  usecase_test* > errorlog.txt");
  if (nfiles < 1) {
    fprintf(_stderr,"[ERROR] Invalid number of files: %d!",(ulong)(uint)nfiles);
    return;
  }
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar7 = 1; iVar7 - nfiles != 1; iVar7 = iVar7 + 1) {
    std::__cxx11::to_string(&local_1c0,iVar7);
    std::operator+(&test_title,"./usecase_test",&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&files,&test_title);
    std::__cxx11::string::~string((string *)&test_title);
  }
  uVar3 = readers + writers;
  if (uVar3 == 0 || SCARRY4(readers,writers) != (int)uVar3 < 0) {
    fprintf(_stderr,"[ERROR] Invalid number of readers (%d)/writers (%d)!");
  }
  else {
    if (useSnapHandlePool) {
      this = (SnapHandlePool *)operator_new(0x98);
      this_00 = &local_70;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_00,&files);
      SnapHandlePool::SnapHandlePool(this,this_00,nhandles);
    }
    else {
      this = (SnapHandlePool *)operator_new(0x58);
      this_00 = &local_58;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_00,&files);
      FileHandlePool::FileHandlePool((FileHandlePool *)this,this_00,nhandles);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_00);
    ppVar1 = (pthread_t *)operator_new__((ulong)uVar3 * 8);
    oa.time = (float)time;
    lVar6 = 0;
    uVar2 = 0;
    if (0 < writers) {
      uVar2 = (ulong)(uint)writers;
    }
    uVar4 = 0;
    if (0 < readers) {
      uVar4 = (ulong)(uint)readers;
    }
    ppVar8 = ppVar1;
    oa.hp = &this->super_FileHandlePool;
    oa.snapPoolAvailable = useSnapHandlePool;
    for (; -lVar6 != uVar2; lVar6 = lVar6 + -1) {
      pthread_create(ppVar8,(pthread_attr_t *)0x0,invoke_writer_ops,&oa);
      ppVar8 = ppVar8 + 1;
    }
    ppVar8 = ppVar1 + uVar2;
    lVar5 = (uVar4 - uVar2) - lVar6;
    while (bVar9 = lVar5 != 0, lVar5 = lVar5 + -1, bVar9) {
      pthread_create(ppVar8,(pthread_attr_t *)0x0,invoke_reader_ops,&oa);
      ppVar8 = ppVar8 + 1;
    }
    if (((int)uVar4 - readers) - writers != (int)lVar6) {
      __assert_fail("threadid == readers + writers",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                    ,0x288,
                    "void test_readers_writers_with_handle_pool(int, int, int, int, bool, int)");
    }
    uVar2 = 0;
    while (uVar3 != uVar2) {
      iVar7 = pthread_join(ppVar1[uVar2],(void **)0x0);
      uVar2 = uVar2 + 1;
      if (iVar7 != 0) {
        __assert_fail("r == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                      ,0x28d,
                      "void test_readers_writers_with_handle_pool(int, int, int, int, bool, int)");
      }
    }
    operator_delete__(ppVar1);
    std::__cxx11::to_string(&local_140,nhandles);
    std::operator+(&local_120,&local_140,"H, ");
    std::__cxx11::to_string(&local_160,nfiles);
    std::operator+(&local_100,&local_120,&local_160);
    std::operator+(&local_e0,&local_100,"F, ");
    std::__cxx11::to_string(&local_180,writers);
    std::operator+(&local_c0,&local_e0,&local_180);
    std::operator+(&local_a0,&local_c0,"RW, ");
    std::__cxx11::to_string(&local_1a0,readers);
    std::operator+(&local_1c0,&local_a0,&local_1a0);
    std::operator+(&test_title,&local_1c0,"RO - ");
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::append((char *)&test_title);
    FileHandlePool::displayCollection(&this->super_FileHandlePool,test_title._M_dataplus._M_p);
    (*(this->super_FileHandlePool)._vptr_FileHandlePool[1])(this);
    fdb_shutdown();
    system("rm -rf  usecase_test* > errorlog.txt");
    memleak_end();
    fprintf(_stderr,"%s PASSED\n",test_title._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&test_title);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  return;
}

Assistant:

void test_readers_writers_with_handle_pool(int nhandles,
                                           int nfiles,
                                           int writers,
                                           int readers,
                                           bool useSnapHandlePool,
                                           int time) {
    TEST_INIT();
    memleak_start();

    int r;

    r = system(SHELL_DEL" usecase_test* > errorlog.txt");
    (void)r;

    if (nfiles < 1) {
        fprintf(stderr, "[ERROR] Invalid number of files: %d!", nfiles);
        return;
    }

    // Set filename(s)
    std::vector<std::string> files;
    for (int i = 1; i <= nfiles; ++i) {
        std::string filename("./usecase_test" + std::to_string(i));
        files.push_back(filename);
    }

    if (writers + readers < 1) {
        fprintf(stderr, "[ERROR] Invalid number of readers (%d)/writers (%d)!",
                readers, writers);
        return;
    }

    // Prepare handle pool
    FileHandlePool *hp;
    if (!useSnapHandlePool) {
        hp = new FileHandlePool(files, nhandles);
    } else {
        hp = new SnapHandlePool(files, nhandles);
    }

    thread_t *threads = new thread_t[writers + readers];

    struct ops_args oa{hp, (float)time, useSnapHandlePool};

    int threadid = 0;
    // Spawn writer thread(s)
    for (int i = 0; i < writers; ++i) {
        thread_create(&threads[threadid++], invoke_writer_ops, &oa);
    }

    // Spawn reader thread(s)
    for (int i = 0; i < readers; ++i) {
        thread_create(&threads[threadid++], invoke_reader_ops, &oa);
    }

    assert(threadid == readers + writers);

    // Wait for child threads
    for (int j = 0; j < (readers + writers); ++j) {
        int r = thread_join(threads[j], nullptr);
        assert(r == 0);
    }
    delete[] threads;

    std::string test_title(std::to_string(nhandles) + "H, " +
                           std::to_string(nfiles) + "F, " +
                           std::to_string(writers) + "RW, " +
                           std::to_string(readers) + "RO - ");
    test_title += useSnapHandlePool ? "Seperate Pool test" : "Shared Pool test";

    /* Print Collected Stats */
    hp->displayCollection(test_title.c_str());

#ifdef __DEBUG_USECASE
    hp->printHandleStats();
#endif

    /* cleanup */
    delete hp;

    /* shutdown */
    fdb_shutdown();

#ifndef __DEBUG_USECASE
    r = system(SHELL_DEL" usecase_test* > errorlog.txt");
    (void)r;
#endif

    memleak_end();
    TEST_RESULT(test_title.c_str());
}